

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

int __thiscall
CVmObjFile::getp_get_pos(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  long lVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  
  if (getp_get_pos(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_pos();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_pos::desc);
  if (iVar2 == 0) {
    check_valid_file(this);
    vVar3 = (**(code **)(**(long **)((this->super_CVmObject).ext_ + 8) + 0x38))();
    lVar1 = *(long *)((this->super_CVmObject).ext_ + 0x20);
    if (lVar1 != 0) {
      vVar3 = vVar3 - (int)*(undefined8 *)(lVar1 + 8);
    }
    retval->typ = VM_INT;
    (retval->val).obj = vVar3;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_get_pos(VMG_ vm_obj_id_t self, vm_val_t *retval,
                             uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* get the position */
    retval->set_int(get_pos(vmg0_));

    /* handled */
    return TRUE;
}